

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O2

void __thiscall Game::play(Game *this)

{
  GameResult GVar1;
  
  printIntro(this);
  while (((this->gameResult).bulls != 4 && (this->guessCount < 0xf))) {
    GVar1 = getGuess(this);
    this->gameResult = GVar1;
    this->guessCount = this->guessCount + 1;
    printGuessResult(this);
  }
  promptUserToPlayAgain(this);
  if (this->wantsToPlay == true) {
    resetGame(this);
    return;
  }
  return;
}

Assistant:

void Game::play()
{
	printIntro();
	// while player has not won or limit of retries has not been reached
	while (not hasWon() and hasTries()) // play the game
	{
		gameResult = getGuess();
		++guessCount;
		printGuessResult();
	}
	promptUserToPlayAgain();
	if (wantsToPlay)
		resetGame();
}